

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipp.hpp
# Opt level: O1

void __thiscall clipp::detail::scoped_dfs_traverser::check_if_left_scope(scoped_dfs_traverser *this)

{
  pointer pcVar1;
  pointer pcVar2;
  _Elt_pointer pmVar3;
  bool bVar4;
  int iVar5;
  _Elt_pointer pmVar6;
  int iVar7;
  _Elt_pointer pmVar8;
  
  pcVar1 = (this->posAfterLastMatch_).stack_.
           super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pcVar2 = (this->posAfterLastMatch_).stack_.
           super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if ((pcVar1 != pcVar2) &&
     (iVar7 = (int)((ulong)((long)(this->pos_).stack_.
                                  super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(this->pos_).stack_.
                                 super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
                                 ._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x55555555,
     iVar5 = (int)((ulong)((long)pcVar2 - (long)pcVar1) >> 3),
     SBORROW4(iVar7,iVar5 * -0x55555555) != iVar7 + iVar5 * 0x55555555 < 0)) {
    pmVar8 = (this->scopes_).c.
             super__Deque_base<clipp::group::depth_first_traverser::memento,_std::allocator<clipp::group::depth_first_traverser::memento>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (pmVar8 != (this->scopes_).c.
                  super__Deque_base<clipp::group::depth_first_traverser::memento,_std::allocator<clipp::group::depth_first_traverser::memento>_>
                  ._M_impl.super__Deque_impl_data._M_start._M_cur) {
      do {
        pmVar3 = (this->scopes_).c.
                 super__Deque_base<clipp::group::depth_first_traverser::memento,_std::allocator<clipp::group::depth_first_traverser::memento>_>
                 ._M_impl.super__Deque_impl_data._M_finish._M_first;
        pmVar6 = pmVar8;
        if (pmVar8 == pmVar3) {
          pmVar6 = (this->scopes_).c.
                   super__Deque_base<clipp::group::depth_first_traverser::memento,_std::allocator<clipp::group::depth_first_traverser::memento>_>
                   ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x10;
        }
        if (pmVar6[-1].level_ <
            (int)((ulong)((long)(this->pos_).stack_.
                                super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)(this->pos_).stack_.
                               super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
                               ._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x55555555)
        break;
        if (pmVar8 == pmVar3) {
          pmVar8 = (this->scopes_).c.
                   super__Deque_base<clipp::group::depth_first_traverser::memento,_std::allocator<clipp::group::depth_first_traverser::memento>_>
                   ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x10;
        }
        group::depth_first_traverser::undo(&this->pos_,pmVar8 + -1);
        std::
        deque<clipp::group::depth_first_traverser::memento,_std::allocator<clipp::group::depth_first_traverser::memento>_>
        ::pop_back(&(this->scopes_).c);
        pmVar8 = (this->scopes_).c.
                 super__Deque_base<clipp::group::depth_first_traverser::memento,_std::allocator<clipp::group::depth_first_traverser::memento>_>
                 ._M_impl.super__Deque_impl_data._M_finish._M_cur;
      } while (pmVar8 != (this->scopes_).c.
                         super__Deque_base<clipp::group::depth_first_traverser::memento,_std::allocator<clipp::group::depth_first_traverser::memento>_>
                         ._M_impl.super__Deque_impl_data._M_start._M_cur);
    }
    pcVar1 = (this->posAfterLastMatch_).stack_.
             super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((this->posAfterLastMatch_).stack_.
        super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
        ._M_impl.super__Vector_impl_data._M_finish != pcVar1) {
      (this->posAfterLastMatch_).stack_.
      super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
      ._M_impl.super__Vector_impl_data._M_finish = pcVar1;
    }
  }
  pmVar8 = (this->scopes_).c.
           super__Deque_base<clipp::group::depth_first_traverser::memento,_std::allocator<clipp::group::depth_first_traverser::memento>_>
           ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (pmVar8 != (this->scopes_).c.
                super__Deque_base<clipp::group::depth_first_traverser::memento,_std::allocator<clipp::group::depth_first_traverser::memento>_>
                ._M_impl.super__Deque_impl_data._M_start._M_cur) {
    do {
      pmVar3 = (this->scopes_).c.
               super__Deque_base<clipp::group::depth_first_traverser::memento,_std::allocator<clipp::group::depth_first_traverser::memento>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_first;
      pmVar6 = pmVar8;
      if (pmVar8 == pmVar3) {
        pmVar6 = (this->scopes_).c.
                 super__Deque_base<clipp::group::depth_first_traverser::memento,_std::allocator<clipp::group::depth_first_traverser::memento>_>
                 ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x10;
      }
      if (pmVar6[-1].level_ <=
          (int)((ulong)((long)(this->pos_).stack_.
                              super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(this->pos_).stack_.
                             super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
                             ._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x55555555) break;
      if (pmVar8 == pmVar3) {
        pmVar8 = (this->scopes_).c.
                 super__Deque_base<clipp::group::depth_first_traverser::memento,_std::allocator<clipp::group::depth_first_traverser::memento>_>
                 ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x10;
      }
      group::depth_first_traverser::undo(&this->pos_,pmVar8 + -1);
      std::
      deque<clipp::group::depth_first_traverser::memento,_std::allocator<clipp::group::depth_first_traverser::memento>_>
      ::pop_back(&(this->scopes_).c);
      pmVar8 = (this->scopes_).c.
               super__Deque_base<clipp::group::depth_first_traverser::memento,_std::allocator<clipp::group::depth_first_traverser::memento>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_cur;
    } while (pmVar8 != (this->scopes_).c.
                       super__Deque_base<clipp::group::depth_first_traverser::memento,_std::allocator<clipp::group::depth_first_traverser::memento>_>
                       ._M_impl.super__Deque_impl_data._M_start._M_cur);
  }
  bVar4 = repeat_group_continues(this);
  this->repeatGroupContinues_ = bVar4;
  return;
}

Assistant:

void check_if_left_scope()
    {
        if(posAfterLastMatch_) {
            if(pos_.level() < posAfterLastMatch_.level()) {
                while(!scopes_.empty() && scopes_.top().level() >= pos_.level()) {
                    pos_.undo(scopes_.top());
                    scopes_.pop();
                }
                posAfterLastMatch_.invalidate();
            }
        }
        while(!scopes_.empty() && scopes_.top().level() > pos_.level()) {
            pos_.undo(scopes_.top());
            scopes_.pop();
        }
        repeatGroupContinues_ = repeat_group_continues();
    }